

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertGtHandlerShouldBeCalled_Test::~AssertionTest_assertGtHandlerShouldBeCalled_Test
          (AssertionTest_assertGtHandlerShouldBeCalled_Test *this)

{
  AssertionTest_assertGtHandlerShouldBeCalled_Test *this_local;
  
  ~AssertionTest_assertGtHandlerShouldBeCalled_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(AssertionTest, assertGtHandlerShouldBeCalled)
{
    std::int32_t a = 1;
    std::int32_t b = 1;
    CPP_ASSERT_GT(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_GT(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}